

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

ON_2dPoint __thiscall ON_2dPoint::operator*(ON_2dPoint *this,ON_Xform *xform)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  double dVar4;
  ON_2dPoint local_18;
  
  dVar1 = this->x;
  dVar2 = this->y;
  dVar4 = dVar1 * xform->m_xform[0][3] + dVar2 * xform->m_xform[1][3] + xform->m_xform[3][3];
  uVar3 = -(ulong)(dVar4 != 0.0);
  dVar4 = (double)(~uVar3 & 0x3ff0000000000000 | (ulong)(1.0 / dVar4) & uVar3);
  ON_2dPoint(&local_18,
             (xform->m_xform[0][0] * dVar1 + xform->m_xform[1][0] * dVar2 + xform->m_xform[3][0]) *
             dVar4,dVar4 * (xform->m_xform[0][1] * dVar1 + xform->m_xform[1][1] * dVar2 +
                           xform->m_xform[3][1]));
  return local_18;
}

Assistant:

ON_2dPoint ON_2dPoint::operator*( const ON_Xform& xform ) const
{
  const double px = x; // optimizer should put px,py in registers
  const double py = y;
  double hx[2], w;
  const double* m = &xform.m_xform[0][0];
  hx[0] = m[0]*px + m[4]*py + m[12];
  hx[1] = m[1]*px + m[5]*py + m[13];
  w     = m[3]*px + m[7]*py + m[15];
  w = (w != 0.0) ? 1.0/w : 1.0;
  return ON_2dPoint( w*hx[0], w*hx[1] );
}